

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_split_pyr(REF_SUBDIV ref_subdiv)

{
  REF_INT *pRVar1;
  REF_CELL ref_cell;
  REF_CELL pRVar2;
  REF_CELL pRVar3;
  bool bVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  uint uVar7;
  uint uVar8;
  REF_STATUS RVar9;
  undefined8 uVar10;
  size_t __size;
  int iVar11;
  void *unaff_RBP;
  REF_INT cell;
  REF_INT RVar12;
  long lVar13;
  REF_INT new_cell;
  REF_CELL pyr_split;
  REF_INT nodes [27];
  REF_CELL tet_split;
  REF_CELL pri_split;
  REF_INT new_nodes [27];
  REF_INT local_15c;
  long local_158;
  REF_CELL local_150;
  REF_INT local_148;
  REF_INT RStack_144;
  REF_INT RStack_140;
  REF_INT RStack_13c;
  REF_INT RStack_138;
  void *local_d0;
  REF_CELL local_c8;
  REF_CELL local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  REF_INT local_a8;
  REF_INT local_a4 [25];
  REF_CELL local_40;
  REF_CELL local_38;
  
  ref_cell = ref_subdiv->grid->cell[9];
  iVar11 = ref_cell->max;
  if ((long)iVar11 < 0) {
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x719,
           "ref_subdiv_split_pyr","malloc marked_for_removal of REF_INT negative");
    __size = 1;
  }
  else {
    __size = (long)iVar11 * 4;
    unaff_RBP = malloc(__size);
    if (unaff_RBP == (void *)0x0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x719,"ref_subdiv_split_pyr","malloc marked_for_removal of REF_INT NULL");
      __size = 2;
      unaff_RBP = (void *)0x0;
    }
    else {
      bVar4 = true;
      if (iVar11 != 0) {
        memset(unaff_RBP,0,__size);
      }
    }
  }
  uVar8 = (uint)__size;
  if (bVar4) {
    local_d0 = unaff_RBP;
    uVar7 = ref_cell_create(&local_150,ref_cell->type);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x71b,"ref_subdiv_split_pyr",(ulong)uVar7,"temp pyr");
      __size = (size_t)uVar7;
    }
    uVar8 = (uint)__size;
    if (uVar7 == 0) {
      pRVar2 = ref_subdiv->grid->cell[10];
      uVar7 = ref_cell_create(&local_c0,pRVar2->type);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x71e,"ref_subdiv_split_pyr",(ulong)uVar7,"temp pri");
        __size = (size_t)uVar7;
      }
      uVar8 = (uint)__size;
      if (uVar7 == 0) {
        pRVar3 = ref_subdiv->grid->cell[8];
        uVar7 = ref_cell_create(&local_c8,pRVar3->type);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x721,"ref_subdiv_split_pyr",(ulong)uVar7,"temp pri");
          __size = (size_t)uVar7;
        }
        uVar8 = (uint)__size;
        if (uVar7 == 0) {
          local_40 = pRVar3;
          local_38 = pRVar2;
          if (0 < ref_cell->max) {
            lVar13 = 0;
            do {
              iVar11 = (int)lVar13;
              if (ref_cell->c2n[(long)iVar11 * (long)ref_cell->size_per] != -1) {
                uVar8 = ref_subdiv_map(ref_subdiv,ref_cell,iVar11);
                local_158 = lVar13;
                uVar7 = ref_cell_nodes(ref_cell,iVar11,&local_148);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x725,"ref_subdiv_split_pyr",(ulong)uVar7,"nodes");
                  __size = (size_t)uVar7;
                }
                RVar6 = RStack_13c;
                RVar5 = RStack_144;
                RVar12 = local_148;
                lVar13 = local_158;
                if (uVar7 != 0) {
                  return (REF_STATUS)__size;
                }
                cell = (REF_INT)local_158;
                if ((int)uVar8 < 0x5c) {
                  if ((int)uVar8 < 0x22) {
                    if (uVar8 == 0) goto LAB_001f3816;
                    if (uVar8 != 0x14) {
LAB_001f3b0f:
                      ref_subdiv_map_to_edge(uVar8);
                      printf("pyr %d, map %d\n",local_158,(ulong)uVar8);
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x841,"ref_subdiv_split_pyr",6,"map not implemented yet");
                      return 6;
                    }
                    *(undefined4 *)((long)local_d0 + local_158 * 4) = 1;
                    uVar8 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_b8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x741,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,local_148,RStack_13c,(REF_INT *)&local_b8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x744,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,RStack_144,RStack_138,
                                       (REF_INT *)((long)&local_b8 + 4));
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x747,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x748,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_nodes(ref_cell,(REF_INT)local_158,(REF_INT *)&local_b8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x74a,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,local_148,RStack_13c,
                                       (REF_INT *)((long)&uStack_b0 + 4));
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x74d,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    lVar13 = local_158;
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_144,RStack_138,&local_a8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x750,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                    if (uVar8 != 0) {
                      uVar10 = 0x751;
                      goto LAB_001f37f2;
                    }
                  }
                  else if (uVar8 == 0x22) {
                    *(undefined4 *)((long)local_d0 + local_158 * 4) = 1;
                    uVar8 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_b8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x76b,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,local_148,RStack_140,(REF_INT *)&local_b8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x76e,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,RStack_13c,RStack_140,
                                       (REF_INT *)((long)&uStack_b0 + 4));
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x771,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    lVar13 = local_158;
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x772,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_nodes(ref_cell,(REF_INT)lVar13,(REF_INT *)&local_b8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x774,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,local_148,RStack_140,(REF_INT *)&uStack_b0);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x777,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_140,local_a4);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x77a,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_add(local_c0,(REF_INT *)&local_b8,&local_15c);
                    if (uVar8 != 0) {
                      uVar10 = 0x77b;
                      goto LAB_001f37f2;
                    }
                  }
                  else if (uVar8 == 0x40) {
                    *(undefined4 *)((long)local_d0 + local_158 * 4) = 1;
                    uVar8 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_b8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7c5,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,RStack_138,RStack_140,(REF_INT *)&uStack_b0);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7c8,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7c9,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    local_b8 = CONCAT44(RStack_144,local_148);
                    uStack_b0 = CONCAT44(uStack_b0._4_4_,RStack_140);
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,RStack_138,RStack_140,
                                       (REF_INT *)((long)&uStack_b0 + 4));
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,2000,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_add(local_c8,(REF_INT *)&local_b8,&local_15c);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7d1,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    local_b8 = CONCAT44(RStack_140,local_148);
                    uStack_b0 = CONCAT44(uStack_b0._4_4_,RStack_13c);
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,RStack_138,RStack_140,
                                       (REF_INT *)((long)&uStack_b0 + 4));
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7d8,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    lVar13 = local_158;
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_add(local_c8,(REF_INT *)&local_b8,&local_15c);
                    if (uVar8 != 0) {
                      uVar10 = 0x7d9;
                      goto LAB_001f37f2;
                    }
                  }
                  else {
                    if (uVar8 != 0x48) goto LAB_001f3b0f;
                    *(undefined4 *)((long)local_d0 + local_158 * 4) = 1;
                    uVar8 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_b8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x756,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,RStack_144,RStack_140,
                                       (REF_INT *)((long)&local_b8 + 4));
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x759,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_138,RStack_140,&local_a8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x75c,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x75d,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_b8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x75f,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between
                                      (ref_subdiv,RStack_144,RStack_140,(REF_INT *)&uStack_b0);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x762,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_138,RStack_140,local_a4);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x765,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                      __size = (size_t)uVar8;
                    }
                    if (uVar8 != 0) {
                      return (REF_STATUS)__size;
                    }
                    uVar8 = ref_cell_add(local_c0,(REF_INT *)&local_b8,&local_15c);
                    if (uVar8 != 0) {
                      uVar10 = 0x766;
                      goto LAB_001f37f2;
                    }
                  }
                }
                else {
                  if ((int)uVar8 < 0x8b) {
                    if (uVar8 != 0x5c) {
                      if (uVar8 != 0x81) goto LAB_001f3b0f;
                      *(undefined4 *)((long)local_d0 + local_158 * 4) = 1;
                      uVar8 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_b8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x72c,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,local_148,RStack_144,(REF_INT *)&local_b8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x72f,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,RStack_13c,RStack_138,
                                         (REF_INT *)((long)&uStack_b0 + 4));
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x732,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      lVar13 = local_158;
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x733,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_cell_nodes(ref_cell,(REF_INT)lVar13,(REF_INT *)&local_b8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x735,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,local_148,RStack_144,
                                         (REF_INT *)((long)&local_b8 + 4));
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x738,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_138,&local_a8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x73b,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                      if (uVar8 != 0) {
                        uVar10 = 0x73c;
                        goto LAB_001f37f2;
                      }
                      goto LAB_001f380d;
                    }
                    local_148 = RStack_144;
                    RStack_144 = RStack_138;
                    RStack_13c = RVar12;
                    RStack_138 = RVar6;
                  }
                  else if (uVar8 != 0x8b) {
                    if (uVar8 == 0xeb) {
                      *(undefined4 *)((long)local_d0 + local_158 * 4) = 1;
                      uVar8 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_b8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x780,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                        __size = (size_t)uVar8;
                      }
                      pRVar1 = (REF_INT *)((long)&uStack_b0 + 4);
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,local_148,RStack_140,(REF_INT *)&local_b8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x783,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,RStack_144,RStack_140,
                                         (REF_INT *)((long)&local_b8 + 4));
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x786,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_140,pRVar1);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x789,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_138,RStack_140,&local_a8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x78c,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x78d,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,local_148,RStack_144,(REF_INT *)&local_b8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x791,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,RStack_144,RStack_140,
                                         (REF_INT *)((long)&local_b8 + 4));
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x794,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,RStack_140,local_148,(REF_INT *)&uStack_b0);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x797,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_138,pRVar1);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x79a,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_138,RStack_140,&local_a8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x79d,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_140,RStack_13c,local_a4);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7a0,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_cell_add(local_c0,(REF_INT *)&local_b8,&local_15c);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7a1,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_cell_nodes(ref_cell,(REF_INT)local_158,(REF_INT *)&local_b8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7a3,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,local_148,RStack_144,
                                         (REF_INT *)((long)&local_b8 + 4));
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7a6,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,local_148,RStack_140,(REF_INT *)&uStack_b0);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7a9,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_138,&local_a8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7ac,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_140,local_a4);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7af,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_cell_add(local_c0,(REF_INT *)&local_b8,&local_15c);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7b0,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_cell_nodes(ref_cell,(REF_INT)local_158,(REF_INT *)&local_b8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7b2,"ref_subdiv_split_pyr",(ulong)uVar8,"nodes");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,local_148,RStack_144,(REF_INT *)&local_b8);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7b5,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between
                                        (ref_subdiv,RStack_144,RStack_140,(REF_INT *)&uStack_b0);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7b8,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_138,pRVar1);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7bb,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      lVar13 = local_158;
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_138,RStack_140,local_a4);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x7be,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                        __size = (size_t)uVar8;
                      }
                      if (uVar8 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar8 = ref_cell_add(local_c0,(REF_INT *)&local_b8,&local_15c);
                      if (uVar8 != 0) {
                        uVar10 = 0x7bf;
                        goto LAB_001f37f2;
                      }
                      goto LAB_001f380d;
                    }
                    if (uVar8 != 0xe1) goto LAB_001f3b0f;
                    local_148 = RStack_138;
                    RStack_144 = RStack_13c;
                    RStack_13c = RVar5;
                    RStack_138 = RVar12;
                  }
                  *(undefined4 *)((long)local_d0 + local_158 * 4) = 1;
                  local_a8 = RStack_138;
                  local_b8 = CONCAT44(RStack_144,local_148);
                  uStack_b0 = CONCAT44(RStack_13c,RStack_140);
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,local_148,RStack_144,(REF_INT *)&local_b8);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x7f7,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  pRVar1 = (REF_INT *)((long)&uStack_b0 + 4);
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_138,pRVar1);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x7fa,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,RStack_144,RStack_140,(REF_INT *)&uStack_b0);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x7fd,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x7fe,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  local_a8 = RStack_138;
                  local_b8 = CONCAT44(RStack_144,local_148);
                  uStack_b0 = CONCAT44(RStack_13c,RStack_140);
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,local_148,RStack_144,
                                     (REF_INT *)((long)&local_b8 + 4));
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x803,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_138,&local_a8);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x806,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,local_148,RStack_140,(REF_INT *)&uStack_b0);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x809,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_cell_add(local_150,(REF_INT *)&local_b8,&local_15c);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x80a,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uStack_b0 = CONCAT44(RStack_13c,RStack_140);
                  local_a8 = RStack_138;
                  local_b8 = CONCAT44(RStack_144,RStack_138);
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,RStack_13c,RStack_138,
                                     (REF_INT *)((long)&local_b8 + 4));
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x811,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_144,RStack_140,pRVar1);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x814,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_cell_add(local_c8,(REF_INT *)&local_b8,&local_15c);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x815,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  local_a8 = RStack_138;
                  local_b8 = CONCAT44(RStack_144,local_148);
                  uStack_b0 = CONCAT44(RStack_13c,RStack_140);
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,RStack_13c,RStack_138,(REF_INT *)&local_b8);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x81a,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  local_b8 = CONCAT44(uStack_b0._4_4_,(REF_INT)local_b8);
                  uVar8 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_140,pRVar1);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x81e,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_cell_add(local_c8,(REF_INT *)&local_b8,&local_15c);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x81f,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  local_a8 = RStack_138;
                  local_b8 = CONCAT44(RStack_144,local_148);
                  uStack_b0 = CONCAT44(RStack_13c,RStack_140);
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,local_148,RStack_140,(REF_INT *)&local_b8);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x825,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,RStack_144,RStack_140,
                                     (REF_INT *)((long)&local_b8 + 4));
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x828,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_138,pRVar1);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x82b,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_cell_add(local_c8,(REF_INT *)&local_b8,&local_15c);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x82c,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  local_a8 = RStack_138;
                  local_b8 = CONCAT44(RStack_144,local_148);
                  uStack_b0 = CONCAT44(RStack_13c,RStack_140);
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,local_148,RStack_140,(REF_INT *)&local_b8);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x831,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,local_148,RStack_144,
                                     (REF_INT *)((long)&local_b8 + 4));
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x834,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between
                                    (ref_subdiv,RStack_144,RStack_140,(REF_INT *)&uStack_b0);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x837,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_13c,RStack_138,pRVar1);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x83a,"ref_subdiv_split_pyr",(ulong)uVar8,"mis");
                    __size = (size_t)uVar8;
                  }
                  lVar13 = local_158;
                  if (uVar8 != 0) {
                    return (REF_STATUS)__size;
                  }
                  uVar8 = ref_cell_add(local_c8,(REF_INT *)&local_b8,&local_15c);
                  if (uVar8 != 0) {
                    uVar10 = 0x83b;
LAB_001f37f2:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,uVar10,"ref_subdiv_split_pyr",(ulong)uVar8,"add");
                    __size = (size_t)uVar8;
                  }
                }
LAB_001f380d:
                if (uVar8 != 0) {
                  return (REF_STATUS)__size;
                }
              }
LAB_001f3816:
              lVar13 = lVar13 + 1;
            } while (lVar13 < ref_cell->max);
          }
          if (0 < ref_cell->max) {
            lVar13 = 0;
            do {
              if (*(int *)((long)local_d0 + lVar13 * 4) == 1) {
                uVar8 = ref_cell_remove(ref_cell,(REF_INT)lVar13);
                if (uVar8 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x847,"ref_subdiv_split_pyr",(ulong)uVar8,"remove");
                  __size = (size_t)uVar8;
                }
                if (uVar8 != 0) {
                  return (REF_STATUS)__size;
                }
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < ref_cell->max);
          }
          if (0 < local_150->max) {
            iVar11 = 0;
            do {
              RVar9 = ref_cell_nodes(local_150,iVar11,&local_148);
              if (RVar9 == 0) {
                uVar8 = ref_subdiv_add_local_cell(ref_subdiv,ref_cell,&local_148);
                if (uVar8 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x84a,"ref_subdiv_split_pyr",(ulong)uVar8,"add local");
                  __size = (size_t)uVar8;
                }
                if (uVar8 != 0) {
                  return (REF_STATUS)__size;
                }
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < local_150->max);
          }
          if (0 < local_c0->max) {
            RVar12 = 0;
            do {
              RVar9 = ref_cell_nodes(local_c0,RVar12,&local_148);
              if (RVar9 == 0) {
                uVar8 = ref_subdiv_add_local_cell(ref_subdiv,local_38,&local_148);
                if (uVar8 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x84d,"ref_subdiv_split_pyr",(ulong)uVar8,"add local");
                  __size = (size_t)uVar8;
                }
                if (uVar8 != 0) {
                  return (REF_STATUS)__size;
                }
              }
              RVar12 = RVar12 + 1;
            } while (RVar12 < local_c0->max);
          }
          if (0 < local_c8->max) {
            iVar11 = 0;
            do {
              RVar9 = ref_cell_nodes(local_c8,iVar11,&local_148);
              if (RVar9 == 0) {
                uVar8 = ref_subdiv_add_local_cell(ref_subdiv,local_40,&local_148);
                if (uVar8 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x850,"ref_subdiv_split_pyr",(ulong)uVar8,"add local");
                  __size = (size_t)uVar8;
                }
                if (uVar8 != 0) {
                  return (REF_STATUS)__size;
                }
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < local_c8->max);
          }
          uVar8 = ref_cell_free(local_150);
          if (uVar8 == 0) {
            uVar8 = ref_cell_free(local_c0);
            if (uVar8 == 0) {
              uVar8 = ref_cell_free(local_c8);
              if (uVar8 == 0) {
                free(local_d0);
                uVar8 = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x854,"ref_subdiv_split_pyr",(ulong)uVar8,"temp pri free");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x853,"ref_subdiv_split_pyr",(ulong)uVar8,"temp pri free");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x852,"ref_subdiv_split_pyr",(ulong)uVar8,"temp pyr free");
          }
        }
      }
    }
  }
  return uVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_pyr(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL pyr, pri, tet;
  REF_CELL pyr_split, pri_split, tet_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT map;
  REF_INT node;

  pyr = ref_grid_pyr(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(pyr), REF_INT, 0);

  RSS(ref_cell_create(&pyr_split, ref_cell_type(pyr)), "temp pyr");

  pri = ref_grid_pri(ref_subdiv_grid(ref_subdiv));
  RSS(ref_cell_create(&pri_split, ref_cell_type(pri)), "temp pri");

  tet = ref_grid_tet(ref_subdiv_grid(ref_subdiv));
  RSS(ref_cell_create(&tet_split, ref_cell_type(tet)), "temp pri");

  each_ref_cell_valid_cell(pyr, cell) {
    map = ref_subdiv_map(ref_subdiv, pyr, cell);
    RSS(ref_cell_nodes(pyr, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 129: /* split into two pyr on edges 0, 7*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");
        break;
      case 20: /* split into two pyr on edges 2, 4*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");
        break;
      case 72: /* split into pyr and pri edge 3-6 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");
        break;
      case 34: /* split into pyr and pri edge 1-5 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");
        break;
      case 235: /* split into 1 pyr, 2 pri*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");

        break;
      case 64: /* split into 1 pyr, 3 tet, on edge 6, nodes 2, 4*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        new_nodes[0] = nodes[0];
        new_nodes[1] = nodes[1];
        new_nodes[2] = nodes[2];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        new_nodes[0] = nodes[0];
        new_nodes[1] = nodes[2];
        new_nodes[2] = nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        break;
      case 139:
      case 225:
      case 92:

        if (225 == map) {
          for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
          nodes[0] = new_nodes[4];
          nodes[1] = new_nodes[3];
          nodes[2] = new_nodes[2];
          nodes[3] = new_nodes[1];
          nodes[4] = new_nodes[0];
        }

        if (92 == map) {
          for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
          nodes[0] = new_nodes[1];
          nodes[1] = new_nodes[4];
          nodes[2] = new_nodes[2];
          nodes[3] = new_nodes[0];
          nodes[4] = new_nodes[3];
        }

        marked_for_removal[cell] = 1;

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        /* top sides */
        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        new_nodes[0] = new_nodes[4];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[0])),
            "mis");
        new_nodes[1] = new_nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        /* center */
        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pyr %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  for (cell = 0; cell < ref_cell_max(pyr); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(pyr, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(pyr_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, pyr, nodes), "add local");

  each_ref_cell_valid_cell_with_nodes(pri_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, pri, nodes), "add local");

  each_ref_cell_valid_cell_with_nodes(tet_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, tet, nodes), "add local");

  RSS(ref_cell_free(pyr_split), "temp pyr free");
  RSS(ref_cell_free(pri_split), "temp pri free");
  RSS(ref_cell_free(tet_split), "temp pri free");

  free(marked_for_removal);

  return REF_SUCCESS;
}